

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

void __thiscall
flow::RegExpGroupInstr::RegExpGroupInstr(RegExpGroupInstr *this,ConstantInt *groupId,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_39;
  ConstantInt *local_38;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_30;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  local_38 = groupId;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_30,__l,&local_39);
  Instr::Instr(&this->super_Instr,String,
               (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_30,name);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_30);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_0019c370;
  return;
}

Assistant:

RegExpGroupInstr(ConstantInt* groupId, const std::string& name)
      : Instr{LiteralType::String, {groupId}, name} {}